

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_triangle_fan(rf_vec2 *points,int points_count,rf_color color)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  rf_render_batch *prVar6;
  long lVar7;
  rf_vertex_buffer *prVar8;
  rf_gfx_texcoord_data_type *prVar9;
  rf_context *prVar10;
  ulong uVar11;
  
  if (2 < points_count) {
    prVar6 = (rf__ctx->field_0).current_batch;
    lVar7 = prVar6->current_buffer;
    prVar8 = prVar6->vertex_buffers;
    if (prVar8[lVar7].elements_count * 4 <= prVar8[lVar7].v_counter + points_count * 4 + -8) {
      rf_gfx_draw();
    }
    prVar10 = rf__ctx;
    if ((rf__ctx->field_0).tex_shapes.id == 0) {
      (rf__ctx->field_0).tex_shapes.id = (rf__ctx->field_0).default_texture_id;
      (prVar10->field_0).tex_shapes.width = 1;
      (prVar10->field_0).tex_shapes.height = 1;
      (prVar10->field_0).tex_shapes.mipmaps = 1;
      (prVar10->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
      *(undefined4 *)&(prVar10->field_0).tex_shapes.valid = 0;
      (prVar10->field_0).rec_tex_shapes.x = 0.0;
      (prVar10->field_0).rec_tex_shapes.y = 0.0;
      (prVar10->field_0).rec_tex_shapes.width = 1.0;
      (prVar10->field_0).rec_tex_shapes.height = 1.0;
    }
    rf_gfx_enable_texture((prVar10->field_0).tex_shapes.id);
    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    if (1 < points_count - 1U) {
      uVar11 = 1;
      do {
        iVar4 = (rf__ctx->field_0).tex_shapes.height;
        fVar2 = (rf__ctx->field_0).rec_tex_shapes.y;
        prVar6 = (rf__ctx->field_0).current_batch;
        lVar7 = prVar6->current_buffer;
        prVar8 = prVar6->vertex_buffers;
        prVar9 = prVar8[lVar7].texcoords;
        iVar5 = prVar8[lVar7].tc_counter;
        prVar9[(long)iVar5 * 2] =
             (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
        prVar9[iVar5 * 2 + 1] = fVar2 / (float)iVar4;
        prVar8[lVar7].tc_counter = prVar8[lVar7].tc_counter + 1;
        rf_gfx_vertex3f(points->x,points->y,prVar6->current_depth);
        fVar2 = (rf__ctx->field_0).rec_tex_shapes.y;
        fVar3 = (rf__ctx->field_0).rec_tex_shapes.height;
        iVar4 = (rf__ctx->field_0).tex_shapes.height;
        prVar6 = (rf__ctx->field_0).current_batch;
        lVar7 = prVar6->current_buffer;
        prVar8 = prVar6->vertex_buffers;
        prVar9 = prVar8[lVar7].texcoords;
        iVar5 = prVar8[lVar7].tc_counter;
        prVar9[(long)iVar5 * 2] =
             (rf__ctx->field_0).rec_tex_shapes.x / (float)(rf__ctx->field_0).tex_shapes.width;
        prVar9[iVar5 * 2 + 1] = (fVar2 + fVar3) / (float)iVar4;
        prVar8[lVar7].tc_counter = prVar8[lVar7].tc_counter + 1;
        rf_gfx_vertex3f(points[uVar11].x,points[uVar11].y,prVar6->current_depth);
        fVar2 = (rf__ctx->field_0).rec_tex_shapes.y;
        fVar3 = (rf__ctx->field_0).rec_tex_shapes.height;
        iVar4 = (rf__ctx->field_0).tex_shapes.height;
        prVar6 = (rf__ctx->field_0).current_batch;
        lVar7 = prVar6->current_buffer;
        prVar8 = prVar6->vertex_buffers;
        prVar9 = prVar8[lVar7].texcoords;
        iVar5 = prVar8[lVar7].tc_counter;
        prVar9[(long)iVar5 * 2] =
             ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
             (float)(rf__ctx->field_0).tex_shapes.width;
        prVar9[iVar5 * 2 + 1] = (fVar2 + fVar3) / (float)iVar4;
        prVar8[lVar7].tc_counter = prVar8[lVar7].tc_counter + 1;
        uVar1 = uVar11 + 1;
        rf_gfx_vertex3f(points[uVar11 + 1].x,points[uVar11 + 1].y,prVar6->current_depth);
        iVar4 = (rf__ctx->field_0).tex_shapes.height;
        fVar2 = (rf__ctx->field_0).rec_tex_shapes.y;
        prVar6 = (rf__ctx->field_0).current_batch;
        lVar7 = prVar6->current_buffer;
        prVar8 = prVar6->vertex_buffers;
        prVar9 = prVar8[lVar7].texcoords;
        iVar5 = prVar8[lVar7].tc_counter;
        prVar9[(long)iVar5 * 2] =
             ((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width) /
             (float)(rf__ctx->field_0).tex_shapes.width;
        prVar9[iVar5 * 2 + 1] = fVar2 / (float)iVar4;
        prVar8[lVar7].tc_counter = prVar8[lVar7].tc_counter + 1;
        rf_gfx_vertex3f(points[uVar11 + 1].x,points[uVar11 + 1].y,prVar6->current_depth);
        uVar11 = uVar1;
      } while (points_count - 1U != uVar1);
    }
    rf_gfx_end();
    rf_gfx_disable_texture();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_fan(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit((points_count - 2) * 4)) rf_gfx_draw();

        rf_gfx_enable_texture(rf_get_shapes_texture().id);
        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 1; i < points_count - 1; i++)
        {
            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[0].x, points[0].y);

            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i].x, points[i].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
        rf_gfx_disable_texture();
    }
}